

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es.c
# Opt level: O0

err_t esRead(int argc,char **argv)

{
  int iVar1;
  bool_t bVar2;
  u32 uVar3;
  err_t eVar4;
  size_t sVar5;
  file_t pFVar6;
  long *in_RSI;
  int in_EDI;
  size_t read;
  octet buf [2048];
  file_t file;
  size_t count;
  size_t par;
  char source [6];
  err_t code;
  char *in_stack_fffffffffffff798;
  char *in_stack_fffffffffffff7a0;
  char **in_stack_fffffffffffff7a8;
  char *in_stack_fffffffffffff7b0;
  file_t local_840;
  size_t in_stack_fffffffffffff7c8;
  char *in_stack_fffffffffffff7d0;
  size_t in_stack_fffffffffffff7d8;
  void *in_stack_fffffffffffff7e0;
  size_t *in_stack_fffffffffffff7e8;
  file_t local_30;
  err_t local_14;
  err_t local_4;
  
  if (in_EDI != 3) {
    return 0x25b;
  }
  iVar1 = strCmp(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  if (iVar1 == 0) {
    strCopy(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8);
    iVar1 = (int)in_stack_fffffffffffff7b0;
  }
  else {
    iVar1 = strCmp(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    if (iVar1 == 0) {
      strCopy(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8);
      iVar1 = (int)in_stack_fffffffffffff7b0;
    }
    else {
      iVar1 = strCmp(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      if (iVar1 == 0) {
        strCopy(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8);
        iVar1 = (int)in_stack_fffffffffffff7b0;
      }
      else {
        iVar1 = strCmp(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        if (iVar1 == 0) {
          strCopy(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8);
          iVar1 = (int)in_stack_fffffffffffff7b0;
        }
        else {
          bVar2 = strStartsWith((char *)*in_RSI,"timer");
          if (bVar2 == 0) {
            return 0x25b;
          }
          strCopy(in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8);
          iVar1 = (int)in_stack_fffffffffffff7b0;
          sVar5 = strLen((char *)0x112680);
          *in_RSI = sVar5 + *in_RSI;
          bVar2 = decIsValid(in_stack_fffffffffffff798);
          if ((((bVar2 == 0) || (sVar5 = strLen((char *)0x1126b6), sVar5 == 0)) ||
              (sVar5 = strLen((char *)0x1126cc), 3 < sVar5)) ||
             (sVar5 = decCLZ((char *)*in_RSI), sVar5 != 0)) {
            return 0x25b;
          }
          decToU32((char *)*in_RSI);
        }
      }
    }
  }
  bVar2 = decIsValid(in_stack_fffffffffffff798);
  if (((bVar2 == 0) || (sVar5 = strLen((char *)0x112753), sVar5 == 0)) ||
     ((sVar5 = strLen((char *)0x11276a), 4 < sVar5 ||
      (sVar5 = decCLZ((char *)in_RSI[1]), sVar5 != 0)))) {
    local_4 = 0x25b;
  }
  else {
    uVar3 = decToU32((char *)in_RSI[1]);
    local_30 = (file_t)((ulong)uVar3 << 10);
    local_4 = cmdFileValNotExist(iVar1,in_stack_fffffffffffff7a8);
    if (local_4 == 0) {
      pFVar6 = fileOpen(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      local_4 = 0xcb;
      if (pFVar6 != (file_t)0x0) {
        local_4 = 0;
      }
      if (local_4 == 0) {
        for (; local_30 != (file_t)0x0; local_30 = (file_t)((long)local_30 - (long)local_840)) {
          eVar4 = rngReadSourceEx(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                                  in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
                                  in_stack_fffffffffffff7c8);
          if (eVar4 != 0) {
            fileClose((file_t)0x112904);
            return eVar4;
          }
          pFVar6 = local_30;
          if ((file_t)0x800 < local_30) {
            pFVar6 = (file_t)0x800;
          }
          local_14 = 0;
          if (local_840 != pFVar6) {
            local_14 = 0xcf;
          }
          if (local_14 != 0) {
            fileClose((file_t)0x11297a);
            return local_14;
          }
          pFVar6 = (file_t)fileWrite2(local_840,pFVar6,(size_t)in_stack_fffffffffffff798);
          if (pFVar6 != local_840) {
            local_14 = 0xce;
          }
          if (local_14 != 0) {
            fileClose((file_t)0x1129cd);
            return local_14;
          }
        }
        bVar2 = fileClose((file_t)0x112a07);
        local_4 = 0x67;
        if (bVar2 != 0) {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static err_t esRead(int argc, char *argv[])
{
	err_t code;
	char source[6];
	size_t par = 0;
	size_t count;
	file_t file;
	octet buf[2048];
	// разбор командной строки: число параметров
	if (argc != 3)
		return ERR_CMD_PARAMS;
	// разбор командной строки: источник энтропии
	if (strEq(argv[0], "trng"))
		strCopy(source, "trng");
	else if (strEq(argv[0], "trng2"))
		strCopy(source, "trng2");
	else if (strEq(argv[0], "sys"))
		strCopy(source, "sys");
	else if (strEq(argv[0], "timer"))
		strCopy(source, "timer");
	else if (strStartsWith(argv[0], "timer"))
	{
		strCopy(source, "timer");
		argv[0]	+= strLen("timer");
		if (!decIsValid(argv[0]) || !strLen(argv[0]) || 
			strLen(argv[0]) > 3 || decCLZ(argv[0]))
			return ERR_CMD_PARAMS;
		par = (size_t)decToU32(argv[0]);
	}
	else
		return ERR_CMD_PARAMS;
	// разбор командной строки: число Кбайтов
	if (!decIsValid(argv[1]) || !strLen(argv[1]) || 
		strLen(argv[1]) > 4 || decCLZ(argv[1]))
		return ERR_CMD_PARAMS;
	count = (size_t)decToU32(argv[1]);
	if (((count << 10) >> 10) != count)
		return ERR_OUTOFRANGE;
	count <<= 10;
	// разбор командной строки: имя выходного файла
	code = cmdFileValNotExist(1, argv + 2);
	ERR_CALL_CHECK(code);
	code = cmdFileOpen(file, argv[2], "wb");
	ERR_CALL_CHECK(code);
	// выгрузка данных
	while (count)
	{
		size_t read;
		// читать
		code = rngReadSourceEx(&read, buf,
			MIN2(sizeof(buf), count), source, par);
		ERR_CALL_HANDLE(code, cmdFileClose(file));
		if (read != MIN2(sizeof(buf), count))
			code = ERR_FILE_READ;
		ERR_CALL_HANDLE(code, cmdFileClose(file));
		// писать
		if (fileWrite2(file, buf, read) != read)
			code = ERR_FILE_WRITE;
		ERR_CALL_HANDLE(code, cmdFileClose(file));
		count -= read;
	}
	// завершение
	return cmdFileClose(file);
}